

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O3

int x9_62_create_context(ptls_key_exchange_algorithm_t *algo,st_x9_62_keyex_context_t **ctx)

{
  st_x9_62_keyex_context_t *psVar1;
  BN_CTX *pBVar2;
  st_x9_62_keyex_context_t *ctx_00;
  
  psVar1 = (st_x9_62_keyex_context_t *)malloc(0x30);
  *ctx = psVar1;
  ctx_00 = (st_x9_62_keyex_context_t *)0x0;
  if (psVar1 != (st_x9_62_keyex_context_t *)0x0) {
    (psVar1->super).algo = algo;
    (psVar1->super).pubkey.base = (uint8_t *)0x0;
    (psVar1->super).pubkey.len = 0;
    (psVar1->super).on_exchange = x9_62_on_exchange;
    psVar1->bn_ctx = (BN_CTX *)0x0;
    psVar1->privkey = (EC_KEY *)0x0;
    pBVar2 = BN_CTX_new();
    (*ctx)->bn_ctx = (BN_CTX *)pBVar2;
    if (pBVar2 != (BN_CTX *)0x0) {
      return 0;
    }
    ctx_00 = *ctx;
  }
  x9_62_free_context(ctx_00);
  *ctx = (st_x9_62_keyex_context_t *)0x0;
  return 0x201;
}

Assistant:

static int x9_62_create_context(ptls_key_exchange_algorithm_t *algo, struct st_x9_62_keyex_context_t **ctx)
{
    int ret;

    if ((*ctx = (struct st_x9_62_keyex_context_t *)malloc(sizeof(**ctx))) == NULL) {
        ret = PTLS_ERROR_NO_MEMORY;
        goto Exit;
    }
    **ctx = (struct st_x9_62_keyex_context_t){{algo, {NULL}, x9_62_on_exchange}};

    if (((*ctx)->bn_ctx = BN_CTX_new()) == NULL) {
        ret = PTLS_ERROR_NO_MEMORY;
        goto Exit;
    }

    ret = 0;
Exit:
    if (ret != 0) {
        x9_62_free_context(*ctx);
        *ctx = NULL;
    }
    return ret;
}